

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
DependencyScan::RecomputeOutputDirty
          (DependencyScan *this,Edge *edge,Node *most_recent_input,string *command,Node *output)

{
  long lVar1;
  FILE *pFVar2;
  LogEntry *this_00;
  Node *pNVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  TimeStamp TVar7;
  TimeStamp TVar8;
  char *pcVar9;
  undefined8 uVar10;
  BuildLog *pBVar11;
  string *psVar12;
  uint64_t uVar13;
  undefined8 uVar14;
  size_t extraout_RDX;
  StringPiece command_00;
  StringPiece local_c0;
  allocator<char> local_a9;
  string local_a8;
  byte local_85;
  bool generator;
  allocator<char> local_71;
  string local_70;
  byte local_49;
  long lStack_48;
  bool used_restat;
  TimeStamp output_mtime;
  LogEntry *entry;
  Node *output_local;
  string *command_local;
  Node *most_recent_input_local;
  Edge *edge_local;
  DependencyScan *this_local;
  
  entry = (LogEntry *)output;
  output_local = (Node *)command;
  command_local = &most_recent_input->path_;
  most_recent_input_local = (Node *)edge;
  edge_local = (Edge *)this;
  bVar4 = Edge::is_phony(edge);
  if (bVar4) {
    bVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                       &(most_recent_input_local->path_).field_2);
    if ((bVar4) && (bVar4 = Node::exists((Node *)entry), pFVar2 = _stderr, !bVar4)) {
      if ((g_explaining & 1U) != 0) {
        Node::path_abi_cxx11_((Node *)entry);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"ninja explain: output %s of phony edge with no inputs doesn\'t exist\n",
                uVar6);
      }
      return true;
    }
    this_00 = entry;
    if (command_local != (string *)0x0) {
      TVar7 = Node::mtime((Node *)command_local);
      Node::UpdatePhonyMtime((Node *)this_00,TVar7);
    }
    return false;
  }
  output_mtime = 0;
  bVar4 = Node::exists((Node *)entry);
  pFVar2 = _stderr;
  if (!bVar4) {
    if ((g_explaining & 1U) != 0) {
      Node::path_abi_cxx11_((Node *)entry);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"ninja explain: output %s doesn\'t exist\n",uVar6);
    }
    return true;
  }
  if (command_local != (string *)0x0) {
    TVar7 = Node::mtime((Node *)entry);
    TVar8 = Node::mtime((Node *)command_local);
    if (TVar7 < TVar8) {
      lStack_48 = Node::mtime((Node *)entry);
      pNVar3 = most_recent_input_local;
      local_49 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"restat",&local_71);
      bVar5 = Edge::GetBindingBool((Edge *)pNVar3,&local_70);
      bVar4 = false;
      if (bVar5) {
        pBVar11 = build_log(this);
        bVar4 = false;
        if (pBVar11 != (BuildLog *)0x0) {
          pBVar11 = build_log(this);
          psVar12 = Node::path_abi_cxx11_((Node *)entry);
          output_mtime = (TimeStamp)BuildLog::LookupByOutput(pBVar11,psVar12);
          bVar4 = (LogEntry *)output_mtime != (LogEntry *)0x0;
        }
      }
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      if (bVar4) {
        lStack_48 = *(long *)(output_mtime + 0x30);
        local_49 = 1;
      }
      lVar1 = lStack_48;
      TVar7 = Node::mtime((Node *)command_local);
      pFVar2 = _stderr;
      if (lVar1 < TVar7) {
        if ((g_explaining & 1U) != 0) {
          pcVar9 = "";
          if ((local_49 & 1) != 0) {
            pcVar9 = "restat of ";
          }
          Node::path_abi_cxx11_((Node *)entry);
          uVar6 = std::__cxx11::string::c_str();
          Node::path_abi_cxx11_((Node *)command_local);
          uVar10 = std::__cxx11::string::c_str();
          lVar1 = lStack_48;
          TVar7 = Node::mtime((Node *)command_local);
          fprintf(pFVar2,"ninja explain: %soutput %s older than most recent input %s (%ld vs %ld)\n"
                  ,pcVar9,uVar6,uVar10,lVar1,TVar7);
        }
        return true;
      }
    }
  }
  pBVar11 = build_log(this);
  pNVar3 = most_recent_input_local;
  if (pBVar11 == (BuildLog *)0x0) {
    return false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"generator",&local_a9);
  bVar4 = Edge::GetBindingBool((Edge *)pNVar3,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_85 = bVar4;
  if (output_mtime == 0) {
    pBVar11 = build_log(this);
    psVar12 = Node::path_abi_cxx11_((Node *)entry);
    output_mtime = (TimeStamp)BuildLog::LookupByOutput(pBVar11,psVar12);
    if ((LogEntry *)output_mtime == (LogEntry *)0x0) goto LAB_00131150;
  }
  if ((local_85 & 1) == 0) {
    StringPiece::StringPiece(&local_c0,&output_local->path_);
    command_00.len_ = extraout_RDX;
    command_00.str_ = (char *)local_c0.len_;
    uVar13 = BuildLog::LogEntry::HashCommand((LogEntry *)local_c0.str_,command_00);
    pFVar2 = _stderr;
    if (uVar13 != *(uint64_t *)(output_mtime + 0x20)) {
      if ((g_explaining & 1U) != 0) {
        Node::path_abi_cxx11_((Node *)entry);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"ninja explain: command line changed for %s\n",uVar6);
      }
      return true;
    }
  }
  if ((command_local != (string *)0x0) &&
     (lVar1 = *(long *)(output_mtime + 0x30), TVar7 = Node::mtime((Node *)command_local),
     pFVar2 = _stderr, lVar1 < TVar7)) {
    if ((g_explaining & 1U) != 0) {
      Node::path_abi_cxx11_((Node *)entry);
      uVar10 = std::__cxx11::string::c_str();
      Node::path_abi_cxx11_((Node *)command_local);
      uVar14 = std::__cxx11::string::c_str();
      uVar6 = *(undefined8 *)(output_mtime + 0x30);
      TVar7 = Node::mtime((Node *)command_local);
      fprintf(pFVar2,
              "ninja explain: recorded mtime of %s older than most recent input %s (%ld vs %ld)\n",
              uVar10,uVar14,uVar6,TVar7);
    }
    return true;
  }
LAB_00131150:
  pFVar2 = _stderr;
  if ((output_mtime == 0) && ((local_85 & 1) == 0)) {
    if ((g_explaining & 1U) != 0) {
      Node::path_abi_cxx11_((Node *)entry);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"ninja explain: command line not found in log for %s\n",uVar6);
    }
    return true;
  }
  return false;
}

Assistant:

bool DependencyScan::RecomputeOutputDirty(const Edge* edge,
                                          const Node* most_recent_input,
                                          const string& command,
                                          Node* output) {
  if (edge->is_phony()) {
    // Phony edges don't write any output.  Outputs are only dirty if
    // there are no inputs and we're missing the output.
    if (edge->inputs_.empty() && !output->exists()) {
      EXPLAIN("output %s of phony edge with no inputs doesn't exist",
              output->path().c_str());
      return true;
    }

    // Update the mtime with the newest input. Dependents can thus call mtime()
    // on the fake node and get the latest mtime of the dependencies
    if (most_recent_input) {
      output->UpdatePhonyMtime(most_recent_input->mtime());
    }

    // Phony edges are clean, nothing to do
    return false;
  }

  BuildLog::LogEntry* entry = 0;

  // Dirty if we're missing the output.
  if (!output->exists()) {
    EXPLAIN("output %s doesn't exist", output->path().c_str());
    return true;
  }

  // Dirty if the output is older than the input.
  if (most_recent_input && output->mtime() < most_recent_input->mtime()) {
    TimeStamp output_mtime = output->mtime();

    // If this is a restat rule, we may have cleaned the output with a restat
    // rule in a previous run and stored the most recent input mtime in the
    // build log.  Use that mtime instead, so that the file will only be
    // considered dirty if an input was modified since the previous run.
    bool used_restat = false;
    if (edge->GetBindingBool("restat") && build_log() &&
        (entry = build_log()->LookupByOutput(output->path()))) {
      output_mtime = entry->mtime;
      used_restat = true;
    }

    if (output_mtime < most_recent_input->mtime()) {
      EXPLAIN("%soutput %s older than most recent input %s "
              "(%" PRId64 " vs %" PRId64 ")",
              used_restat ? "restat of " : "", output->path().c_str(),
              most_recent_input->path().c_str(),
              output_mtime, most_recent_input->mtime());
      return true;
    }
  }

  if (build_log()) {
    bool generator = edge->GetBindingBool("generator");
    if (entry || (entry = build_log()->LookupByOutput(output->path()))) {
      if (!generator &&
          BuildLog::LogEntry::HashCommand(command) != entry->command_hash) {
        // May also be dirty due to the command changing since the last build.
        // But if this is a generator rule, the command changing does not make us
        // dirty.
        EXPLAIN("command line changed for %s", output->path().c_str());
        return true;
      }
      if (most_recent_input && entry->mtime < most_recent_input->mtime()) {
        // May also be dirty due to the mtime in the log being older than the
        // mtime of the most recent input.  This can occur even when the mtime
        // on disk is newer if a previous run wrote to the output file but
        // exited with an error or was interrupted.
        EXPLAIN("recorded mtime of %s older than most recent input %s (%" PRId64 " vs %" PRId64 ")",
                output->path().c_str(), most_recent_input->path().c_str(),
                entry->mtime, most_recent_input->mtime());
        return true;
      }
    }
    if (!entry && !generator) {
      EXPLAIN("command line not found in log for %s", output->path().c_str());
      return true;
    }
  }

  return false;
}